

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

void Wlc_NtkAbsCreateLogic
               (Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vNodeFrames,Vec_Int_t *vFanins,
               Vec_Int_t *vNewObjs,Vec_Wec_t *vConstrs,Wlc_Obj_t *pConstrOut)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *vFanins_00;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Wlc_Obj_t *pWVar7;
  Wlc_Obj_t *pWVar8;
  Wlc_Obj_t *pWVar9;
  Wlc_Obj_t *pObj;
  int iVar10;
  Wlc_Obj_t *local_88;
  
  vFanins_00 = Vec_IntAlloc(100);
  p_00 = Vec_IntAlloc(100);
  if (vNewObjs->nSize != vNodeFrames->nSize * 2) {
    __assert_fail("Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                  ,0x19f,
                  "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                 );
  }
  iVar10 = 0;
  do {
    if (vConstrs->nSize <= iVar10) {
      if (vFanins_00->nSize < 1) {
        iVar10 = Wlc_ObjAlloc(pNew,6,0,0,0);
        pWVar8 = Wlc_NtkObj(pNew,iVar10);
        Vec_IntFill(vFanins,1,0);
      }
      else {
        iVar10 = Wlc_ObjAlloc(pNew,0x17,0,vFanins_00->nSize + -1,0);
        pWVar8 = Wlc_NtkObj(pNew,iVar10);
        Wlc_ObjAddFanins(pNew,pWVar8,vFanins_00);
        Vec_IntFill(vFanins,1,(int)(((long)pWVar8 - (long)pNew->pObjs) / 0x18));
        iVar10 = Wlc_ObjAlloc(pNew,0x26,0,0,0);
        pWVar8 = Wlc_NtkObj(pNew,iVar10);
      }
      Wlc_ObjAddFanins(pNew,pWVar8,vFanins);
      Vec_IntFree(vFanins_00);
      Vec_IntFree(p_00);
      Vec_IntFill(vFanins,1,(int)(((long)pWVar8 - (long)pNew->pObjs) / 0x18));
      Wlc_ObjAddFanins(pNew,pConstrOut,vFanins);
      return;
    }
    p_01 = Vec_WecEntry(vConstrs,iVar10);
    if (p_01->nSize != 0) {
      if (p_01->nSize < 2) {
        __assert_fail("Vec_IntSize(vTrace) >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x1a4,
                      "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                     );
      }
      p_00->nSize = 0;
      uVar1 = Vec_IntEntry(p_01,0);
      uVar2 = Vec_IntEntryLast(p_01);
      iVar3 = Vec_IntEntry(p_01,0);
      iVar3 = Vec_IntFind(vNodeFrames,iVar3);
      iVar4 = Vec_IntEntryLast(p_01);
      iVar4 = Vec_IntFind(vNodeFrames,iVar4);
      if ((iVar3 < 0) || (iVar4 < 0)) {
        __assert_fail("Index[0] >= 0 && Index[1] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x1ac,
                      "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                     );
      }
      uVar2 = uVar2 >> 1 & 0x3ff;
      iVar5 = Vec_IntEntry(vNewObjs,iVar3 * 2);
      pWVar7 = Wlc_NtkObj(pNew,iVar5);
      iVar5 = Vec_IntEntry(vNewObjs,iVar4 * 2);
      pWVar8 = Wlc_NtkObj(pNew,iVar5);
      iVar3 = Vec_IntEntry(vNewObjs,iVar3 * 2 + 1);
      local_88 = Wlc_NtkObj(pNew,iVar3);
      iVar3 = Vec_IntEntry(vNewObjs,iVar4 * 2 + 1);
      pWVar9 = Wlc_NtkObj(pNew,iVar3);
      if ((uVar1 >> 1 & 0x3ff) == uVar2) {
        pWVar7 = Wlc_ObjFo2Fi(pNew,pWVar7);
        local_88 = Wlc_ObjFo2Fi(pNew,local_88);
      }
      pWVar8 = Wlc_ObjFo2Fi(pNew,pWVar8);
      pWVar9 = Wlc_ObjFo2Fi(pNew,pWVar9);
      iVar3 = Wlc_ObjAlloc(pNew,0x1f,0,0,0);
      pObj = Wlc_NtkObj(pNew,iVar3);
      Vec_IntFillTwo(vFanins,2,(int)(((long)pWVar7 - (long)pNew->pObjs) / 0x18),
                     (int)(((long)pWVar8 - (long)pNew->pObjs) / 0x18));
      Wlc_ObjAddFanins(pNew,pObj,vFanins);
      Vec_IntPush(p_00,(int)(((long)pObj - (long)pNew->pObjs) / 0x18));
      iVar3 = Wlc_ObjAlloc(pNew,0x20,0,0,0);
      pWVar7 = Wlc_NtkObj(pNew,iVar3);
      Vec_IntFillTwo(vFanins,2,(int)(((long)local_88 - (long)pNew->pObjs) / 0x18),
                     (int)(((long)pWVar9 - (long)pNew->pObjs) / 0x18));
      Wlc_ObjAddFanins(pNew,pWVar7,vFanins);
      Vec_IntPush(p_00,(int)(((long)pWVar7 - (long)pNew->pObjs) / 0x18));
      for (iVar3 = 1; iVar3 < p_01->nSize + -1; iVar3 = iVar3 + 1) {
        uVar1 = Vec_IntEntry(p_01,iVar3);
        iVar4 = Vec_IntFind(vNodeFrames,uVar1);
        if (iVar4 < 0) {
          __assert_fail("Index[0] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x1cf,
                        "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                       );
        }
        iVar5 = Vec_IntEntry(vNewObjs,iVar4 * 2);
        pWVar9 = Wlc_NtkObj(pNew,iVar5);
        if ((uVar1 >> 1 & 0x3ff) == uVar2) {
          pWVar9 = Wlc_ObjFo2Fi(pNew,pWVar9);
        }
        iVar4 = Vec_IntEntry(vNewObjs,iVar4 * 2 | 1);
        if (iVar4 == 0) {
          pWVar7 = Wlc_NtkObj(p,(int)uVar1 >> 0xb);
          if ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) !=
              (undefined1  [24])0x8) {
            __assert_fail("Wlc_ObjType(Wlc_NtkObj(p, Entry >> 11)) == WLC_OBJ_MUX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                          ,0x1d6,
                          "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                         );
          }
        }
        else {
          iVar5 = pWVar9->End - pWVar9->Beg;
          iVar4 = -iVar5;
          if (0 < iVar5) {
            iVar4 = iVar5;
          }
          iVar6 = pWVar8->End - pWVar8->Beg;
          iVar5 = -iVar6;
          if (0 < iVar6) {
            iVar5 = iVar6;
          }
          if (iVar4 != iVar5) {
            __assert_fail("Wlc_ObjRange(pAddrs[0]) == Wlc_ObjRange(pAddrs[1])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                          ,0x1db,
                          "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                         );
          }
          iVar4 = Wlc_ObjAlloc(pNew,0x20,0,0,0);
          pWVar7 = Wlc_NtkObj(pNew,iVar4);
          Vec_IntFillTwo(vFanins,2,(int)(((long)pWVar9 - (long)pNew->pObjs) / 0x18),
                         (int)(((long)pWVar8 - (long)pNew->pObjs) / 0x18));
          Wlc_ObjAddFanins(pNew,pWVar7,vFanins);
          pWVar9 = pWVar7;
        }
        Vec_IntPush(p_00,(int)(((long)pWVar9 - (long)pNew->pObjs) / 0x18));
      }
      iVar3 = Wlc_ObjAlloc(pNew,0x17,0,p_00->nSize + -1,0);
      pWVar8 = Wlc_NtkObj(pNew,iVar3);
      Wlc_ObjAddFanins(pNew,pWVar8,p_00);
      Vec_IntFill(vFanins,1,(int)(((long)pWVar8 - (long)pNew->pObjs) / 0x18));
      iVar3 = Wlc_ObjAlloc(pNew,0x25,0,0,0);
      pWVar8 = Wlc_NtkObj(pNew,iVar3);
      Wlc_ObjAddFanins(pNew,pWVar8,vFanins);
      Vec_IntPush(vFanins_00,(int)(((long)pWVar8 - (long)pNew->pObjs) / 0x18));
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

void Wlc_NtkAbsCreateLogic( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vNodeFrames, Vec_Int_t * vFanins, Vec_Int_t * vNewObjs, Vec_Wec_t * vConstrs, Wlc_Obj_t * pConstrOut ) 
{
    Vec_Int_t * vTrace; 
    Vec_Int_t * vBitConstr = Vec_IntAlloc( 100 );
    Vec_Int_t * vLevConstr = Vec_IntAlloc( 100 );
    Wlc_Obj_t * pAddrs[2], * pDatas[2], * pCond, * pConstr = NULL;
    int i, k, Entry, Index[2], iFrameLast, iFrameThis;
    assert( Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames) );
    Vec_WecForEachLevel( vConstrs, vTrace, i )
    {
        if ( Vec_IntSize(vTrace) == 0 ) 
            continue;
        assert( Vec_IntSize(vTrace) >= 2 );
        Vec_IntClear( vLevConstr );

        iFrameThis = (Vec_IntEntry(vTrace, 0)  >> 1) & 0x3FF;
        iFrameLast = (Vec_IntEntryLast(vTrace) >> 1) & 0x3FF;

        Index[0] = Vec_IntFind( vNodeFrames, Vec_IntEntry(vTrace, 0) );
        Index[1] = Vec_IntFind( vNodeFrames, Vec_IntEntryLast(vTrace) );
        assert( Index[0] >= 0 && Index[1] >= 0 );

        pAddrs[0] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[0]) );
        pAddrs[1] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[1]) );

        pDatas[0] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[0]+1) );
        pDatas[1] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[1]+1) );

        // redirect the source in the last time frame to point to FOs
        if ( iFrameThis == iFrameLast )
        {
            pAddrs[0] = Wlc_ObjFo2Fi(pNew, pAddrs[0]);
            pDatas[0] = Wlc_ObjFo2Fi(pNew, pDatas[0]);
        }

        // redirect the sink in the last time frame to point to FOs
        pAddrs[1] = Wlc_ObjFo2Fi(pNew, pAddrs[1]);
        pDatas[1] = Wlc_ObjFo2Fi(pNew, pDatas[1]);

        // equal addresses
        pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_EQU, 0, 0, 0));
        Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pAddrs[0]), Wlc_ObjId(pNew, pAddrs[1]) );
        Wlc_ObjAddFanins( pNew, pCond, vFanins );
        Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pCond) );

        // different datas
        pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_NOTEQU, 0, 0, 0));
        Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pDatas[0]), Wlc_ObjId(pNew, pDatas[1]) );
        Wlc_ObjAddFanins( pNew, pCond, vFanins );
        Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pCond) );

        Vec_IntForEachEntryStartStop( vTrace, Entry, k, 1, Vec_IntSize(vTrace)-1 )
        {
            iFrameThis = (Entry >> 1) & 0x3FF;
            Index[0]   = Vec_IntFind( vNodeFrames, Entry );            
            assert( Index[0] >= 0 );
            pAddrs[0]  = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[0]) );
            // redirect the middle in the last time frame to point to FOs
            if ( iFrameThis == iFrameLast )
                pAddrs[0] = Wlc_ObjFo2Fi(pNew, pAddrs[0]);
            if ( Vec_IntEntry(vNewObjs, 2*Index[0]+1) == 0 ) // MUX
            {
                assert( Wlc_ObjType(Wlc_NtkObj(p, Entry >> 11)) == WLC_OBJ_MUX );
                Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pAddrs[0]) );
            }
            else // different addresses
            {
                assert( Wlc_ObjRange(pAddrs[0]) == Wlc_ObjRange(pAddrs[1]) );
                pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_NOTEQU, 0, 0, 0));
                Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pAddrs[0]), Wlc_ObjId(pNew, pAddrs[1]) );
                Wlc_ObjAddFanins( pNew, pCond, vFanins );
                Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pCond) );
            }
        }

        // create last output
        pConstr = Wlc_NtkObj( pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vLevConstr)-1, 0) );
        Wlc_ObjAddFanins( pNew, pConstr, vLevConstr );
        Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pConstr) );
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_REDUCT_AND, 0, 0, 0));
        Wlc_ObjAddFanins( pNew, pConstr, vFanins );

        // save the result
        Vec_IntPush( vBitConstr, Wlc_ObjId(pNew, pConstr) );
    }
    if ( Vec_IntSize(vBitConstr) > 0 )
    {
        // create last output
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vBitConstr)-1, 0));
        Wlc_ObjAddFanins( pNew, pConstr, vBitConstr );
        // create last output
        Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pConstr) );
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_REDUCT_OR, 0, 0, 0));
        Wlc_ObjAddFanins( pNew, pConstr, vFanins );
    }
    else
    {
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_CONST, 0, 0, 0));
        Vec_IntFill( vFanins, 1, 0 ); // const0 - always true
        Wlc_ObjAddFanins( pNew, pConstr, vFanins );
    }
    // cleanup
    Vec_IntFree( vBitConstr );
    Vec_IntFree( vLevConstr );
    // add the constraint as fanin to the output
    Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pConstr) );
    Wlc_ObjAddFanins( pNew, pConstrOut, vFanins );
}